

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O0

bool __thiscall QJsonPrivate::Parser::parseValueIntoContainer(Parser *this)

{
  Type TVar1;
  QCborContainerPrivate *in_RDI;
  long in_FS_OFFSET;
  QCborValue value;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  bool local_29;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  parseValue((Parser *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  TVar1 = QCborValue::type((QCborValue *)local_28);
  if (TVar1 != String) {
    if (TVar1 == Undefined) {
      local_29 = false;
      goto LAB_001b467c;
    }
    QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
              ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x1b4662);
    QCborContainerPrivate::append
              (in_RDI,(QCborValue *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  }
  local_29 = true;
LAB_001b467c:
  QCborValue::~QCborValue((QCborValue *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_29;
}

Assistant:

bool Parser::parseValueIntoContainer()
{
    QCborValue value = parseValue();
    switch (value.type()) {
    case QCborValue::Undefined:
        return false; // error while parsing
    case QCborValue::String:
        break; // strings were already added
    default:
        container->append(std::move(value));
    }

    return true;
}